

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

ArrayObject * __thiscall Js::DynamicObject::EnsureObjectArray(DynamicObject *this)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  JavascriptArray *objArray_00;
  undefined4 *puVar3;
  ArrayObject *pAVar4;
  ArrayObject *objArray;
  ScriptContext *scriptContext;
  DynamicObject *this_local;
  
  bVar2 = HasObjectArray(this);
  if (!bVar2) {
    this_00 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    this_01 = ScriptContext::GetLibrary(this_00);
    objArray_00 = JavascriptLibrary::CreateArray(this_01,0,4);
    SetObjectArray(this,&objArray_00->super_ArrayObject);
  }
  bVar2 = HasObjectArray(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0xb9,"(HasObjectArray())","HasObjectArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pAVar4 = GetObjectArrayOrFlagsAsArray(this);
  return pAVar4;
}

Assistant:

ArrayObject* DynamicObject::EnsureObjectArray()
    {
        if (!HasObjectArray())
        {
            ScriptContext* scriptContext = GetScriptContext();
            ArrayObject* objArray = scriptContext->GetLibrary()->CreateArray(0, SparseArraySegmentBase::SMALL_CHUNK_SIZE);
            SetObjectArray(objArray);
        }
        Assert(HasObjectArray());
        return GetObjectArrayOrFlagsAsArray();
    }